

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClearIniSettings(void)

{
  _func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *p_Var1;
  ImGuiContext *pIVar2;
  ImGuiSettingsHandler *pIVar3;
  int handler_n;
  ImGuiContext *g;
  int local_c;
  
  pIVar2 = GImGui;
  ImGuiTextBuffer::clear((ImGuiTextBuffer *)0x131d81);
  for (local_c = 0; local_c < (pIVar2->SettingsHandlers).Size; local_c = local_c + 1) {
    pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar2->SettingsHandlers,local_c);
    if (pIVar3->ClearAllFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
      pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar2->SettingsHandlers,local_c);
      p_Var1 = pIVar3->ClearAllFn;
      pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar2->SettingsHandlers,local_c);
      (*p_Var1)(pIVar2,pIVar3);
    }
  }
  return;
}

Assistant:

void ImGui::ClearIniSettings()
{
    ImGuiContext& g = *GImGui;
    g.SettingsIniData.clear();
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].ClearAllFn)
            g.SettingsHandlers[handler_n].ClearAllFn(&g, &g.SettingsHandlers[handler_n]);
}